

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void ARM_printInst(MCInst *MI,SStream *O,void *Info)

{
  byte bVar1;
  cs_detail *pcVar2;
  cs_struct *pcVar3;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  MCRegisterClass *pMVar9;
  int64_t iVar10;
  MCOperand *pMVar11;
  MCOperand *pMVar12;
  MCOperand *op;
  MCOperand *pMVar13;
  uint64_t uVar14;
  uint8_t *puVar15;
  char *pcVar16;
  ulong uVar17;
  uint8_t uVar18;
  uint32_t val;
  MCInst NewMI;
  MCInst local_390;
  
  uVar6 = MCInst_getOpcode(MI);
  if ((int)uVar6 < 0x1c1) {
    if ((int)uVar6 < 0xe6) {
      if ((int)uVar6 < 0x98) {
        if (uVar6 == 0x72) goto LAB_001ddbf0;
        if (uVar6 != 0x7f) goto switchD_001ddc1a_default;
      }
      else {
        if (uVar6 == 0x98) {
LAB_001ddcc2:
          pMVar13 = MCInst_getOperand(MI,0);
          uVar7 = MCOperand_getReg(pMVar13);
          if ((uVar7 != 0xc) || (uVar7 = MCInst_getNumOperands(MI), uVar7 < 6))
          goto switchD_001ddc1a_default;
          SStream_concat0(O,"pop");
          MCInst_setOpcodePub(MI,0x1a7);
          printPredicateOperand(MI,2,O);
          if (uVar6 == 0x949) {
            SStream_concat0(O,".w");
          }
          SStream_concat0(O,anon_var_dwarf_326247 + 0x11);
          MI->ac_idx = '\x01';
LAB_001dddc7:
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            bVar1 = pcVar2->regs_read_count;
            pcVar2->regs_read[bVar1] = 0xc;
            pcVar2->regs_read_count = bVar1 + 1;
            bVar1 = pcVar2->regs_write_count;
            pcVar2->regs_write[bVar1] = 0xc;
            pcVar2->regs_write_count = bVar1 + 1;
          }
          goto LAB_001dde01;
        }
        if (uVar6 != 0xa9) {
          if (uVar6 == 0xc0) {
            pMVar13 = MCInst_getOperand(MI,2);
            uVar6 = MCOperand_getReg(pMVar13);
            if (uVar6 == 0xc) {
              pMVar13 = MCInst_getOperand(MI,4);
              iVar10 = MCOperand_getImm(pMVar13);
              if (((((uint)iVar10 >> 0xc & 1) == 0) &&
                  (iVar10 = MCOperand_getImm(pMVar13), ((uint)iVar10 & 0xfff) == 4)) ||
                 (iVar10 = MCOperand_getImm(pMVar13), iVar10 == 4)) {
                SStream_concat0(O,"pop");
                MCInst_setOpcodePub(MI,0x1a7);
                printPredicateOperand(MI,5,O);
                SStream_concat0(O,"\t{");
                pcVar3 = MI->csh;
                pMVar13 = MCInst_getOperand(MI,0);
                uVar6 = MCOperand_getReg(pMVar13);
                pcVar16 = (*pcVar3->get_regname)(uVar6);
                SStream_concat0(O,pcVar16);
                if (MI->csh->detail != CS_OPT_OFF) {
                  pcVar2 = MI->flat_insn->detail;
                  puVar15 = pcVar2->groups +
                            (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
                  puVar15[0] = '\x01';
                  puVar15[1] = '\0';
                  puVar15[2] = '\0';
                  puVar15[3] = '\0';
                  pMVar13 = MCInst_getOperand(MI,0);
                  uVar6 = MCOperand_getReg(pMVar13);
                  pcVar2 = MI->flat_insn->detail;
                  *(uint *)(pcVar2->groups +
                           (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) = uVar6;
                  pcVar2 = MI->flat_insn->detail;
                  pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] =
                       '\x02';
                  puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
                  *puVar15 = *puVar15 + '\x01';
                  pcVar2 = MI->flat_insn->detail;
                  bVar1 = pcVar2->regs_read_count;
                  pcVar2->regs_read[bVar1] = 0xc;
                  pcVar2->regs_read_count = bVar1 + 1;
                  bVar1 = pcVar2->regs_write_count;
                  pcVar2->regs_write[bVar1] = 0xc;
                  pcVar2->regs_write_count = bVar1 + 1;
                }
                goto LAB_001de017;
              }
            }
          }
          goto switchD_001ddc1a_default;
        }
      }
    }
    else {
      if ((int)uVar6 < 0x199) {
        if (uVar6 != 0xe6) {
          if (uVar6 != 0xe7) goto switchD_001ddc1a_default;
          pMVar13 = MCInst_getOperand(MI,0);
          pMVar11 = MCInst_getOperand(MI,1);
          pMVar12 = MCInst_getOperand(MI,2);
          op = MCInst_getOperand(MI,3);
          iVar10 = MCOperand_getImm(op);
          switch((uint)iVar10 & 7) {
          case 1:
            SStream_concat0(O,"asr");
            uVar6 = 0x198;
            break;
          case 2:
            SStream_concat0(O,"lsl");
            uVar6 = 0x19d;
            break;
          case 3:
            SStream_concat0(O,"lsr");
            uVar6 = 0x19e;
            break;
          case 4:
            SStream_concat0(O,"ror");
            uVar6 = 0x1a0;
            break;
          case 5:
            SStream_concat0(O,"rrx");
            uVar6 = 0x1a1;
            break;
          default:
            SStream_concat0(O,anon_var_dwarf_3bac35 + 0x11);
            goto LAB_001de36e;
          }
          MCInst_setOpcodePub(MI,uVar6);
LAB_001de36e:
          printSBitModifierOperand(MI,6,O);
          printPredicateOperand(MI,4,O);
          SStream_concat0(O,anon_var_dwarf_326247 + 0x11);
          pcVar3 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar13);
          pcVar16 = (*pcVar3->get_regname)(uVar6);
          SStream_concat0(O,pcVar16);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            puVar15 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
            puVar15[0] = '\x01';
            puVar15[1] = '\0';
            puVar15[2] = '\0';
            puVar15[3] = '\0';
            uVar6 = MCOperand_getReg(pMVar13);
            pcVar2 = MI->flat_insn->detail;
            *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45)
                 = uVar6;
            pcVar2 = MI->flat_insn->detail;
            pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x02';
            puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar15 = *puVar15 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar3 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar11);
          pcVar16 = (*pcVar3->get_regname)(uVar6);
          SStream_concat0(O,pcVar16);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            puVar15 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
            puVar15[0] = '\x01';
            puVar15[1] = '\0';
            puVar15[2] = '\0';
            puVar15[3] = '\0';
            uVar6 = MCOperand_getReg(pMVar11);
            pcVar2 = MI->flat_insn->detail;
            *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45)
                 = uVar6;
            pcVar2 = MI->flat_insn->detail;
            pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x01';
            puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar15 = *puVar15 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar3 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar12);
          pcVar16 = (*pcVar3->get_regname)(uVar6);
          SStream_concat0(O,pcVar16);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar2 = MI->flat_insn->detail;
          puVar15 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
          puVar15[0] = '\x01';
          puVar15[1] = '\0';
          puVar15[2] = '\0';
          puVar15[3] = '\0';
          uVar6 = MCOperand_getReg(pMVar12);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) =
               uVar6;
          pcVar2 = MI->flat_insn->detail;
          pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x01';
          puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar15 = *puVar15 + '\x01';
          return;
        }
        pMVar13 = MCInst_getOperand(MI,0);
        pMVar11 = MCInst_getOperand(MI,1);
        pMVar12 = MCInst_getOperand(MI,2);
        iVar10 = MCOperand_getImm(pMVar12);
        uVar6 = (uint)iVar10 & 7;
        switch(uVar6) {
        case 1:
          SStream_concat0(O,"asr");
          uVar7 = 0x198;
          break;
        case 2:
          SStream_concat0(O,"lsl");
          uVar7 = 0x19d;
          break;
        case 3:
          SStream_concat0(O,"lsr");
          uVar7 = 0x19e;
          break;
        case 4:
          SStream_concat0(O,"ror");
          uVar7 = 0x1a0;
          break;
        case 5:
          SStream_concat0(O,"rrx");
          uVar7 = 0x1a1;
          break;
        default:
          SStream_concat0(O,anon_var_dwarf_3bac35 + 0x11);
          goto LAB_001de627;
        }
        MCInst_setOpcodePub(MI,uVar7);
LAB_001de627:
        printSBitModifierOperand(MI,5,O);
        printPredicateOperand(MI,3,O);
        SStream_concat0(O,anon_var_dwarf_326247 + 0x11);
        pcVar3 = MI->csh;
        uVar7 = MCOperand_getReg(pMVar13);
        pcVar16 = (*pcVar3->get_regname)(uVar7);
        SStream_concat0(O,pcVar16);
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar2 = MI->flat_insn->detail;
          puVar15 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
          puVar15[0] = '\x01';
          puVar15[1] = '\0';
          puVar15[2] = '\0';
          puVar15[3] = '\0';
          uVar7 = MCOperand_getReg(pMVar13);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) =
               uVar7;
          pcVar2 = MI->flat_insn->detail;
          pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x02';
          puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar15 = *puVar15 + '\x01';
        }
        SStream_concat0(O,", ");
        pcVar3 = MI->csh;
        uVar7 = MCOperand_getReg(pMVar11);
        pcVar16 = (*pcVar3->get_regname)(uVar7);
        SStream_concat0(O,pcVar16);
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar2 = MI->flat_insn->detail;
          puVar15 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
          puVar15[0] = '\x01';
          puVar15[1] = '\0';
          puVar15[2] = '\0';
          puVar15[3] = '\0';
          uVar7 = MCOperand_getReg(pMVar11);
          pcVar2 = MI->flat_insn->detail;
          *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) =
               uVar7;
          pcVar2 = MI->flat_insn->detail;
          pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x01';
          puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar15 = *puVar15 + '\x01';
        }
        if (uVar6 != 5) {
          SStream_concat0(O,", ");
          uVar17 = MCOperand_getImm(pMVar12);
          val = 0x20;
          if (7 < (uint)uVar17) {
            val = (uint)(uVar17 >> 3) & 0x1fffffff;
          }
          printUInt32Bang(O,val);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar2 = MI->flat_insn->detail;
            *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 9) =
                 uVar6;
            pcVar2 = MI->flat_insn->detail;
            *(uint32_t *)
             (pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0xd) = val;
          }
        }
        return;
      }
      if (uVar6 != 0x199) {
        if (uVar6 == 0x19f) {
LAB_001ddd49:
          pMVar13 = MCInst_getOperand(MI,0);
          uVar7 = MCOperand_getReg(pMVar13);
          if ((uVar7 != 0xc) || (uVar7 = MCInst_getNumOperands(MI), uVar7 < 6))
          goto switchD_001ddc1a_default;
          SStream_concat0(O,"push");
          MCInst_setOpcodePub(MI,0x1a8);
          printPredicateOperand(MI,2,O);
          if (uVar6 == 0xa2e) {
            SStream_concat0(O,".w");
          }
          SStream_concat0(O,anon_var_dwarf_326247 + 0x11);
          goto LAB_001dddc7;
        }
        if (uVar6 != 0x1b4) goto switchD_001ddc1a_default;
      }
    }
    pMVar9 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,1);
    pMVar13 = MCInst_getOperand(MI,(uint)(uVar6 == 0x199 || uVar6 == 0x1b4));
    uVar7 = MCOperand_getReg(pMVar13);
    _Var5 = MCRegisterClass_contains(pMVar9,uVar7);
    if (_Var5) {
      MCInst_Init(&local_390);
      MCInst_setOpcode(&local_390,uVar6);
      if ((uVar6 == 0x1b4) || (uVar8 = 2, uVar6 == 0x199)) {
        pMVar13 = MCInst_getOperand(MI,0);
        MCInst_addOperand2(&local_390,pMVar13);
        uVar8 = 3;
      }
      pMVar9 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x12);
      uVar6 = MCRegisterInfo_getMatchingSuperReg((MCRegisterInfo *)Info,uVar7,9,pMVar9);
      MCOperand_CreateReg0(&local_390,uVar6);
      uVar6 = MCInst_getNumOperands(MI);
      if (uVar8 < uVar6) {
        do {
          pMVar13 = MCInst_getOperand(MI,uVar8);
          MCInst_addOperand2(&local_390,pMVar13);
          uVar8 = uVar8 + 1;
          uVar6 = MCInst_getNumOperands(MI);
        } while (uVar8 < uVar6);
      }
      printInstruction(&local_390,O,(MCRegisterInfo *)Info);
      return;
    }
    goto switchD_001ddc1a_default;
  }
  if ((int)uVar6 < 0x928) {
    if ((int)uVar6 < 0x4eb) {
      if (uVar6 == 0x1c1) {
        pMVar13 = MCInst_getOperand(MI,2);
        uVar6 = MCOperand_getReg(pMVar13);
        if (uVar6 == 0xc) {
          pMVar13 = MCInst_getOperand(MI,3);
          iVar10 = MCOperand_getImm(pMVar13);
          if (iVar10 == -4) {
            SStream_concat0(O,"push");
            MCInst_setOpcodePub(MI,0x1a8);
            printPredicateOperand(MI,4,O);
            SStream_concat0(O,"\t{");
            pcVar3 = MI->csh;
            pMVar13 = MCInst_getOperand(MI,1);
            uVar6 = MCOperand_getReg(pMVar13);
            pcVar16 = (*pcVar3->get_regname)(uVar6);
            SStream_concat0(O,pcVar16);
            if (MI->csh->detail != CS_OPT_OFF) {
              pcVar2 = MI->flat_insn->detail;
              puVar15 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41
              ;
              puVar15[0] = '\x01';
              puVar15[1] = '\0';
              puVar15[2] = '\0';
              puVar15[3] = '\0';
              pMVar13 = MCInst_getOperand(MI,1);
              uVar6 = MCOperand_getReg(pMVar13);
              pcVar2 = MI->flat_insn->detail;
              *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45
                       ) = uVar6;
              pcVar3 = MI->csh;
              uVar6 = MCInst_getOpcode(MI);
              bVar1 = MI->ac_idx;
              puVar15 = ARM_get_op_access(pcVar3,uVar6);
              uVar18 = '\0';
              if (puVar15[bVar1] != 0x80) {
                uVar18 = puVar15[bVar1];
              }
              pcVar2 = MI->flat_insn->detail;
              pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = uVar18;
              MI->ac_idx = MI->ac_idx + '\x01';
              puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
              *puVar15 = *puVar15 + '\x01';
            }
LAB_001de017:
            SStream_concat0(O,"}");
            return;
          }
        }
        goto switchD_001ddc1a_default;
      }
      if (uVar6 != 0x4e7) goto switchD_001ddc1a_default;
LAB_001dda74:
      pMVar13 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar13);
      if (uVar6 != 0xc) goto switchD_001ddc1a_default;
      SStream_concat0(O,"vpop");
      uVar6 = 0x1b0;
    }
    else {
      if (uVar6 == 0x4eb) goto LAB_001dda74;
      if ((uVar6 != 0x883) && (uVar6 != 0x887)) goto switchD_001ddc1a_default;
      pMVar13 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar13);
      if (uVar6 != 0xc) goto switchD_001ddc1a_default;
      SStream_concat0(O,"vpush");
      uVar6 = 0x1af;
    }
    MCInst_setOpcodePub(MI,uVar6);
    printPredicateOperand(MI,2,O);
    SStream_concat0(O,anon_var_dwarf_326247 + 0x11);
LAB_001dde01:
    uVar6 = 4;
LAB_001de193:
    printRegisterList(MI,uVar6,O);
    return;
  }
  if ((int)uVar6 < 0xa4d) {
    if (uVar6 != 0x928) {
      if (uVar6 != 0x949) {
        if (uVar6 != 0xa2e) goto switchD_001ddc1a_default;
        goto LAB_001ddd49;
      }
      goto LAB_001ddcc2;
    }
  }
  else {
    if (uVar6 == 0xa4d) {
      pMVar13 = MCInst_getOperand(MI,0);
      uVar6 = MCInst_getNumOperands(MI);
      if ((((uVar6 == 3) && (_Var5 = MCOperand_isImm(pMVar13), _Var5)) &&
          (iVar10 = MCOperand_getImm(pMVar13), iVar10 == 0)) &&
         (uVar14 = ARM_getFeatureBits(MI->csh->mode), (uVar14 >> 0x20 & 1) != 0)) {
        SStream_concat0(O,"eret");
        MCInst_setOpcodePub(MI,0x23);
        printPredicateOperand(MI,1,O);
        return;
      }
      goto switchD_001ddc1a_default;
    }
    if (uVar6 == 0xab1) {
      pMVar13 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar13);
      uVar7 = MCInst_getNumOperands(MI);
      bVar4 = true;
      if (3 < uVar7) {
        uVar7 = 3;
        do {
          pMVar13 = MCInst_getOperand(MI,uVar7);
          uVar8 = MCOperand_getReg(pMVar13);
          bVar4 = (bool)(bVar4 & uVar8 != uVar6);
          uVar7 = uVar7 + 1;
          uVar8 = MCInst_getNumOperands(MI);
        } while (uVar7 < uVar8);
      }
      SStream_concat0(O,"ldm");
      MCInst_setOpcodePub(MI,0x3b);
      printPredicateOperand(MI,1,O);
      SStream_concat0(O,anon_var_dwarf_326247 + 0x11);
      pcVar16 = (*MI->csh->get_regname)(uVar6);
      SStream_concat0(O,pcVar16);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar2 = MI->flat_insn->detail;
        puVar15 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
        puVar15[0] = '\x01';
        puVar15[1] = '\0';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) =
             uVar6;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = '\x03';
        puVar15 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar15 = *puVar15 + '\x01';
      }
      if (bVar4) {
        MI->writeback = true;
        SStream_concat0(O,"!");
      }
      SStream_concat0(O,", ");
      uVar6 = 3;
      goto LAB_001de193;
    }
    if (uVar6 != 0xaad) goto switchD_001ddc1a_default;
  }
LAB_001ddbf0:
  pMVar13 = MCInst_getOperand(MI,0);
  iVar10 = MCOperand_getImm(pMVar13);
  switch(iVar10) {
  case 0:
    uVar7 = 0x1a9;
    pcVar16 = "nop";
    break;
  case 1:
    uVar7 = 0x1aa;
    pcVar16 = "yield";
    break;
  case 2:
    uVar7 = 0x1ab;
    pcVar16 = "wfe";
    break;
  case 3:
    uVar7 = 0x1ac;
    pcVar16 = "wfi";
    break;
  case 4:
    uVar7 = 0x1ad;
    pcVar16 = "sev";
    break;
  case 5:
    uVar14 = ARM_getFeatureBits(MI->csh->mode);
    if ((uVar14 >> 0x29 & 1) != 0) {
      uVar7 = 0x1ae;
      pcVar16 = "sevl";
      break;
    }
  default:
switchD_001ddc1a_default:
    printInstruction(MI,O,(MCRegisterInfo *)Info);
    return;
  }
  SStream_concat0(O,pcVar16);
  printPredicateOperand(MI,1,O);
  if (uVar6 == 0x928) {
    SStream_concat0(O,".w");
  }
  MCInst_setOpcodePub(MI,uVar7);
  return;
}

Assistant:

void ARM_printInst(MCInst *MI, SStream *O, void *Info)
{
	MCRegisterInfo *MRI = (MCRegisterInfo *)Info;
	unsigned Opcode = MCInst_getOpcode(MI), tmp, i, pubOpcode;


	// printf(">>> Opcode 0: %u\n", MCInst_getOpcode(MI));
	switch(Opcode) {
		// Check for HINT instructions w/ canonical names.
		case ARM_HINT:
		case ARM_tHINT:
		case ARM_t2HINT:
			switch (MCOperand_getImm(MCInst_getOperand(MI, 0))) {
				case 0: SStream_concat0(O, "nop"); pubOpcode = ARM_INS_NOP; break;
				case 1: SStream_concat0(O, "yield"); pubOpcode = ARM_INS_YIELD; break;
				case 2: SStream_concat0(O, "wfe"); pubOpcode = ARM_INS_WFE; break;
				case 3: SStream_concat0(O, "wfi"); pubOpcode = ARM_INS_WFI; break;
				case 4: SStream_concat0(O, "sev"); pubOpcode = ARM_INS_SEV; break;
				case 5:
						if ((ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops)) {
							SStream_concat0(O, "sevl");
							pubOpcode = ARM_INS_SEVL;
							break;
						}
						// Fallthrough for non-v8
				default:
						// Anything else should just print normally.
						printInstruction(MI, O, MRI);
						return;
			}
			printPredicateOperand(MI, 1, O);
			if (Opcode == ARM_t2HINT)
				SStream_concat0(O, ".w");

			MCInst_setOpcodePub(MI, pubOpcode);

			return;

			// Check for MOVs and print canonical forms, instead.
		case ARM_MOVsr: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);
							MCOperand *MO3 = MCInst_getOperand(MI, 3);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 6, O);
							printPredicateOperand(MI, 4, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));

							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO2));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO2);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}
							//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
							return;
						}

		case ARM_MOVsi: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 5, O);
							printPredicateOperand(MI, 3, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							if (opc == ARM_AM_rrx) {
								//printAnnotation(O, Annot);
								return;
							}

							SStream_concat0(O, ", ");
							tmp = translateShiftImm(getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
							printUInt32Bang(O, tmp);
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type =
									(arm_shifter)opc;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
							}
							return;
						}

						// A8.6.123 PUSH
		case ARM_STMDB_UPD:
		case ARM_t2STMDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print PUSH if there are at least two registers in the list.
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2STMDB_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");

							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_STR_PRE_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP &&
								MCOperand_getImm(MCInst_getOperand(MI, 3)) == -4) {
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 4, O);
							SStream_concat0(O, "\t{");
							printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 1)));
							if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
								uint8_t access;
#endif
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 1));
#ifndef CAPSTONE_DIET
								access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
								MI->ac_idx++;
#endif
								MI->flat_insn->detail->arm.op_count++;
							}
							SStream_concat0(O, "}");
							return;
						}
						break;

						// A8.6.122 POP
		case ARM_LDMIA_UPD:
		case ARM_t2LDMIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print POP if there are at least two registers in the list.
							SStream_concat0(O, "pop");
							MCInst_setOpcodePub(MI, ARM_INS_POP);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2LDMIA_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							// unlike LDM, POP only write to registers, so skip the 1st access code
							MI->ac_idx = 1;
							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_LDR_POST_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP) {
							MCOperand *MO2 = MCInst_getOperand(MI, 4);
							if ((getAM2Op((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_add &&
										getAM2Offset((unsigned int)MCOperand_getImm(MO2)) == 4) ||
									MCOperand_getImm(MO2) == 4) {
								SStream_concat0(O, "pop");
								MCInst_setOpcodePub(MI, ARM_INS_POP);
								printPredicateOperand(MI, 5, O);
								SStream_concat0(O, "\t{");
								printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 0)));
								if (MI->csh->detail) {
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 0));
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
									MI->flat_insn->detail->arm.op_count++;
                                    // this instruction implicitly read/write SP register
                                    MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_read_count++;
                                    MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_write_count++;
								}
								SStream_concat0(O, "}");
								return;
							}
						}
						break;

						// A8.6.355 VPUSH
		case ARM_VSTMSDB_UPD:
		case ARM_VSTMDDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpush");
							MCInst_setOpcodePub(MI, ARM_INS_VPUSH);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

						// A8.6.354 VPOP
		case ARM_VLDMSIA_UPD:
		case ARM_VLDMDIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpop");
							MCInst_setOpcodePub(MI, ARM_INS_VPOP);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_tLDMIA: {
							 bool Writeback = true;
							 unsigned BaseReg = MCOperand_getReg(MCInst_getOperand(MI, 0));
							 unsigned i;
							 for (i = 3; i < MCInst_getNumOperands(MI); ++i) {
								 if (MCOperand_getReg(MCInst_getOperand(MI, i)) == BaseReg)
									 Writeback = false;
							 }

							 SStream_concat0(O, "ldm");
							 MCInst_setOpcodePub(MI, ARM_INS_LDM);

							 printPredicateOperand(MI, 1, O);
							 SStream_concat0(O, "\t");
							 printRegName(MI->csh, O, BaseReg);
							 if (MI->csh->detail) {
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = BaseReg;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ | CS_AC_WRITE;
								 MI->flat_insn->detail->arm.op_count++;
							 }
							 if (Writeback) {
								 MI->writeback = true;
								 SStream_concat0(O, "!");
							 }
							 SStream_concat0(O, ", ");
							 printRegisterList(MI, 3, O);
							 return;
						 }

						 // Combine 2 GPRs from disassember into a GPRPair to match with instr def.
						 // ldrexd/strexd require even/odd GPR pair. To enforce this constraint,
						 // a single GPRPair reg operand is used in the .td file to replace the two
						 // GPRs. However, when decoding them, the two GRPs cannot be automatically
						 // expressed as a GPRPair, so we have to manually merge them.
						 // FIXME: We would really like to be able to tablegen'erate this.
		case ARM_LDREXD:
		case ARM_STREXD:
		case ARM_LDAEXD:
		case ARM_STLEXD: {
				const MCRegisterClass* MRC = MCRegisterInfo_getRegClass(MRI, ARM_GPRRegClassID);
				bool isStore = Opcode == ARM_STREXD || Opcode == ARM_STLEXD;
				unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, isStore ? 1 : 0));

				if (MCRegisterClass_contains(MRC, Reg)) {
				    MCInst NewMI;

				    MCInst_Init(&NewMI);
				    MCInst_setOpcode(&NewMI, Opcode);

				    if (isStore)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, 0));

				    MCOperand_CreateReg0(&NewMI, MCRegisterInfo_getMatchingSuperReg(MRI, Reg, ARM_gsub_0,
								MCRegisterInfo_getRegClass(MRI, ARM_GPRPairRegClassID)));

				    // Copy the rest operands into NewMI.
				    for(i = isStore ? 3 : 2; i < MCInst_getNumOperands(MI); ++i)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, i));

				    printInstruction(&NewMI, O, MRI);
				    return;
				}
				break;
		 }
		 // B9.3.3 ERET (Thumb)
		 // For a target that has Virtualization Extensions, ERET is the preferred
		 // disassembly of SUBS PC, LR, #0
		case ARM_t2SUBS_PC_LR: {
						MCOperand *opc = MCInst_getOperand(MI, 0);
						if (MCInst_getNumOperands(MI) == 3 &&
							MCOperand_isImm(opc) &&
							MCOperand_getImm(opc) == 0 &&
							(ARM_getFeatureBits(MI->csh->mode) & ARM_FeatureVirtualization)) {
							SStream_concat0(O, "eret");
							MCInst_setOpcodePub(MI, ARM_INS_ERET);
							printPredicateOperand(MI, 1, O);
							return;
						}
						break;
				}
	}

	//if (printAliasInstr(MI, O, MRI))
	//	printInstruction(MI, O, MRI);
	printInstruction(MI, O, MRI);
}